

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AttitudeQuaternionEKF.cpp
# Opt level: O0

void __thiscall
iDynTree::AttitudeQuaternionEKF::prepareMeasurementNoiseCovarianceMatrix
          (AttitudeQuaternionEKF *this,MatrixDynSize *R)

{
  long lVar1;
  Scalar *pSVar2;
  ulong in_RSI;
  long in_RDI;
  Map<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_> Id3;
  Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_> R_;
  DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Map<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>_>
  *in_stack_ffffffffffffff38;
  Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_3,_3,_false>
  *in_stack_ffffffffffffff40;
  DenseCoeffsBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
  *this_00;
  Index in_stack_ffffffffffffff50;
  DenseBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_ffffffffffffff58;
  MatrixDynSize *in_stack_ffffffffffffff68;
  double *in_stack_ffffffffffffff80;
  MatrixBase<Eigen::Map<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_ffffffffffffff88;
  
  lVar1 = iDynTree::MatrixDynSize::rows();
  if (lVar1 != *(long *)(in_RDI + 0x3e0)) {
    lVar1 = iDynTree::MatrixDynSize::cols();
    if (lVar1 != *(long *)(in_RDI + 0x3e0)) {
      iDynTree::MatrixDynSize::resize(in_RSI,*(ulong *)(in_RDI + 0x3e0));
      iDynTree::MatrixDynSize::zero();
    }
  }
  toEigen(in_stack_ffffffffffffff68);
  toEigen<3u,3u>((MatrixFixSize<3U,_3U> *)in_stack_ffffffffffffff58);
  Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,3,3,1,3,3>,0,Eigen::Stride<0,0>>>::operator*
            (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  Eigen::DenseBase<Eigen::Map<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::Stride<0,0>>>::block<3,3>
            (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,in_RDI);
  Eigen::Block<Eigen::Map<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::Stride<0,0>>,3,3,false>::
  operator=(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  if ((*(byte *)(in_RDI + 0x2d8) & 1) != 0) {
    this_00 = *(DenseCoeffsBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                **)(in_RDI + 0x2a8);
    pSVar2 = Eigen::
             DenseCoeffsBase<Eigen::Map<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_1>
             ::operator()(this_00,(Index)in_stack_ffffffffffffff38,0x620b15);
    *pSVar2 = (Scalar)this_00;
  }
  return;
}

Assistant:

void iDynTree::AttitudeQuaternionEKF::prepareMeasurementNoiseCovarianceMatrix(iDynTree::MatrixDynSize& R)
{
    using iDynTree::toEigen;

    if (R.rows() != m_output_size && R.cols() != m_output_size)
    {
        R.resize(m_output_size, m_output_size);
        R.zero();
    }

    auto R_(toEigen(R));
    auto Id3(toEigen(m_Id3));

    R_.block<3, 3>(0, 0) = Id3*m_params_qekf.accelerometer_noise_variance;
    if (m_params_qekf.use_magnetometer_measurements)
    {
        R_(3, 3) = m_params_qekf.magnetometer_noise_variance;
    }
}